

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.h
# Opt level: O2

void __thiscall
Measure<int>::Measure
          (Measure<int> *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *time,string *name,MetricType *type,int *value,vector<Tag,_std::allocator<Tag>_> *tags)

{
  (this->time).__d.__r = (time->__d).__r;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  this->type = *type;
  this->value = *value;
  this->rate = 1.0;
  std::vector<Tag,_std::allocator<Tag>_>::vector(&this->tags,tags);
  spdlog::debug<char[23]>((char (*) [23])"in measure constructor");
  return;
}

Assistant:

Measure(const time_point<high_resolution_clock> &time, const std::string& name, const MetricType &type, const T& value, const std::vector<Tag>& tags)
        : time(time), name(name), type(type), rate(1.0f), value(value), tags(tags) {
        spdlog::debug("in measure constructor");
    }